

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O2

Json __thiscall Client::get(Client *this,string *address)

{
  long lVar1;
  undefined8 *in_RDX;
  json_value extraout_RDX;
  Json JVar2;
  allocator<char> local_c9;
  Result result;
  string local_88;
  Headers headers;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if ((long)address[2]._M_dataplus._M_p < lVar1) {
    requestAccessToken((Client *)address);
  }
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &headers._M_t._M_impl.super__Rb_tree_header._M_header;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const(&)[13],char_const(&)[17]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&headers,(char (*) [13])"Content-Type",(char (*) [17])"application/json");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "bearer ",address + 1);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const(&)[14],std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&headers,(char (*) [14])0x161f74,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  std::__cxx11::string::~string((string *)&result);
  waitForRateLimit((Client *)address);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)*in_RDX,&local_c9);
  httplib::Client::Get(&result,(Client *)address,&local_88,&headers);
  std::__cxx11::string::~string((string *)&local_88);
  resultChecks((Client *)address,&result);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  uStack_20 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)result.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
             (parser_callback_t *)&local_38,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  httplib::Result::~Result(&result);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&headers._M_t);
  JVar2.m_value.object = extraout_RDX.object;
  JVar2._0_8_ = this;
  return JVar2;
}

Assistant:

Json get(const std::string& address) {
        if (accessTokenExpiration < Clock::now()) {
            requestAccessToken();
        }

        httplib::Headers headers;
        headers.emplace("Content-Type", "application/json");
        headers.emplace("Authorization", "bearer " + accessToken);

        waitForRateLimit();
        httplib::Result result = apiClient.Get(address.c_str(), headers);
        resultChecks(result);

        return Json::parse(std::move(result->body));
    }